

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void mark_flashes(FIRSTPASS_STATS *first_stats,FIRSTPASS_STATS *last_stats)

{
  FIRSTPASS_STATS *next_stats;
  FIRSTPASS_STATS *this_stats;
  FIRSTPASS_STATS *last_stats_local;
  FIRSTPASS_STATS *first_stats_local;
  
  this_stats = first_stats;
  while (this_stats < last_stats + -1) {
    if ((this_stats[1].pcnt_second_ref < this_stats[1].pcnt_inter ||
         this_stats[1].pcnt_second_ref == this_stats[1].pcnt_inter) ||
       (this_stats[1].pcnt_second_ref < 0.5)) {
      this_stats->is_flash = 0;
      this_stats = this_stats + 1;
    }
    else {
      this_stats->is_flash = 1;
      this_stats = this_stats + 1;
    }
  }
  if (first_stats <= last_stats + -1) {
    last_stats[-1].is_flash = 0;
  }
  return;
}

Assistant:

static void mark_flashes(FIRSTPASS_STATS *first_stats,
                         FIRSTPASS_STATS *last_stats) {
  FIRSTPASS_STATS *this_stats = first_stats, *next_stats;
  while (this_stats < last_stats - 1) {
    next_stats = this_stats + 1;
    if (next_stats->pcnt_second_ref > next_stats->pcnt_inter &&
        next_stats->pcnt_second_ref >= 0.5) {
      this_stats->is_flash = 1;
    } else {
      this_stats->is_flash = 0;
    }
    this_stats = next_stats;
  }
  // We always treat the last one as none flash.
  if (last_stats - 1 >= first_stats) {
    (last_stats - 1)->is_flash = 0;
  }
}